

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_avx2.c
# Opt level: O0

void av1_highbd_convolve_y_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,int bd)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined8 uVar27;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  undefined1 *puVar28;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar31 [32];
  undefined1 auVar34 [64];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  __m256i res_16bit;
  __m256i res_b_round;
  __m256i res_b;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s78;
  __m256i s67;
  __m256i s56;
  __m256i s45;
  __m256i s34;
  __m256i s23;
  __m256i s12;
  __m256i s01;
  __m256i src6;
  uint16_t *data;
  __m256i zero;
  __m256i clip_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  __m256i coeffs_y [4];
  __m256i s [8];
  uint16_t *src_ptr;
  int fo_vert;
  int j;
  int i;
  InterpFilterParams *in_stack_00000798;
  int in_stack_000007a0;
  int in_stack_000007a8;
  undefined4 uVar35;
  undefined8 uStack_cb0;
  undefined1 local_cc0 [32];
  undefined8 uStack_ca8;
  undefined8 local_c60;
  __m256i *coeffs;
  __m256i *s_00;
  undefined8 *puStack_c48;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 local_a60 [128];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  long local_8d8;
  int local_8d0;
  uint local_8cc;
  int local_8c8;
  int local_8c4;
  int local_8c0;
  int local_8bc;
  long local_8b8;
  int local_8ac;
  undefined1 local_8a0 [16];
  undefined4 local_88c;
  undefined4 local_888;
  ushort local_882;
  undefined1 local_880 [32];
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined1 (*local_758) [16];
  undefined8 *local_750;
  undefined1 (*local_748) [16];
  undefined1 (*local_740) [16];
  undefined8 *local_738;
  undefined8 *local_730;
  undefined1 (*local_728) [16];
  undefined8 *local_720;
  undefined1 (*local_718) [16];
  undefined8 *local_710;
  undefined1 (*local_708) [16];
  undefined8 *local_700;
  undefined1 (*local_6f8) [16];
  undefined8 *local_6f0;
  undefined1 (*local_6e8) [16];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6c0;
  int in_stack_fffffffffffff944;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  uint16_t *in_stack_fffffffffffff950;
  undefined4 uStack_6a8;
  int in_stack_fffffffffffff95c;
  uint16_t *in_stack_fffffffffffff960;
  undefined8 local_100;
  undefined8 uStack_70;
  undefined8 uStack_68;
  InterpFilterParams *filter_params;
  
  if (*(short *)(in_stack_00000008 + 8) == 0xc) {
    av1_highbd_convolve_y_sr_ssse3
              (in_stack_fffffffffffff960,in_stack_fffffffffffff95c,in_stack_fffffffffffff950,
               in_stack_fffffffffffff94c,in_stack_fffffffffffff948,in_stack_fffffffffffff944,
               in_stack_00000798,in_stack_000007a0,in_stack_000007a8);
  }
  else {
    local_8d0 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
    local_8d8 = in_RDI + (long)(local_8d0 * in_ESI) * -2;
    local_88c = 7;
    local_8a0 = ZEXT416(7);
    uVar26 = local_8a0._0_8_;
    local_888 = 0x40;
    auVar32 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar32 = vpinsrd_avx(auVar32,0x40,2);
    auVar32 = vpinsrd_avx(auVar32,0x40,3);
    auVar29 = vpinsrd_avx(ZEXT416(0x40),0x40,1);
    auVar29 = vpinsrd_avx(auVar29,0x40,2);
    auVar29 = vpinsrd_avx(auVar29,0x40,3);
    auVar29 = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar29;
    auVar32 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
    if (subpel_y_qn == 10) {
      uVar35 = 0x3ff;
    }
    else {
      uVar35 = 0xff;
      if (subpel_y_qn == 0xc) {
        uVar35 = 0xfff;
      }
    }
    local_882 = (ushort)uVar35;
    auVar3 = vpinsrw_avx(ZEXT216(local_882),uVar35,1);
    auVar3 = vpinsrw_avx(auVar3,uVar35,2);
    auVar3 = vpinsrw_avx(auVar3,uVar35,3);
    auVar3 = vpinsrw_avx(auVar3,uVar35,4);
    auVar3 = vpinsrw_avx(auVar3,uVar35,5);
    auVar3 = vpinsrw_avx(auVar3,uVar35,6);
    auVar3 = vpinsrw_avx(auVar3,uVar35,7);
    auVar30 = vpinsrw_avx(ZEXT216(local_882),uVar35,1);
    auVar30 = vpinsrw_avx(auVar30,uVar35,2);
    auVar30 = vpinsrw_avx(auVar30,uVar35,3);
    auVar30 = vpinsrw_avx(auVar30,uVar35,4);
    auVar30 = vpinsrw_avx(auVar30,uVar35,5);
    auVar30 = vpinsrw_avx(auVar30,uVar35,6);
    auVar30 = vpinsrw_avx(auVar30,uVar35,7);
    uStack_70 = auVar30._0_8_;
    uStack_68 = auVar30._8_8_;
    local_880._8_8_ = SUB328(ZEXT832(0),4);
    uVar27 = local_880._8_8_;
    auVar34 = ZEXT1664(auVar30);
    local_8c4 = in_R9D;
    local_8c0 = in_R8D;
    local_8bc = in_ECX;
    local_8b8 = in_RDX;
    local_8ac = in_ESI;
    local_880 = ZEXT832(0) << 0x20;
    prepare_coeffs(filter_params,local_cc0._4_4_,(__m256i *)CONCAT44(0x40,uVar35));
    for (local_8cc = 0; (int)local_8cc < local_8c0; local_8cc = local_8cc + 8) {
      local_6e8 = (undefined1 (*) [16])(local_8d8 + (long)(int)local_8cc * 2);
      local_770 = *(undefined8 *)*local_6e8;
      uStack_768 = *(undefined8 *)(*local_6e8 + 8);
      local_6f0 = (undefined8 *)(*local_6e8 + (long)local_8ac * 2);
      local_780 = *local_6f0;
      uStack_778 = local_6f0[1];
      local_6f8 = (undefined1 (*) [16])(*local_6e8 + (long)local_8ac * 2);
      local_790 = *(undefined8 *)*local_6f8;
      uStack_788 = *(undefined8 *)(*local_6f8 + 8);
      local_700 = (undefined8 *)(*local_6e8 + (long)(local_8ac * 2) * 2);
      local_7a0 = *local_700;
      uStack_798 = local_700[1];
      local_708 = (undefined1 (*) [16])(*local_6e8 + (long)(local_8ac * 2) * 2);
      local_7b0 = *(undefined8 *)*local_708;
      uStack_7a8 = *(undefined8 *)(*local_708 + 8);
      local_710 = (undefined8 *)(*local_6e8 + (long)(local_8ac * 3) * 2);
      local_7c0 = *local_710;
      uStack_7b8 = local_710[1];
      local_718 = (undefined1 (*) [16])(*local_6e8 + (long)(local_8ac * 3) * 2);
      local_7d0 = *(undefined8 *)*local_718;
      uStack_7c8 = *(undefined8 *)(*local_718 + 8);
      local_720 = (undefined8 *)(*local_6e8 + (long)(local_8ac << 2) * 2);
      local_7e0 = *local_720;
      uStack_7d8 = local_720[1];
      local_728 = (undefined1 (*) [16])(*local_6e8 + (long)(local_8ac << 2) * 2);
      local_7f0 = *(undefined8 *)*local_728;
      uStack_7e8 = *(undefined8 *)(*local_728 + 8);
      local_730 = (undefined8 *)(*local_6e8 + (long)(local_8ac * 5) * 2);
      local_800 = *local_730;
      uStack_7f8 = local_730[1];
      local_738 = (undefined8 *)(*local_6e8 + (long)(local_8ac * 6) * 2);
      local_b20 = *local_738;
      uStack_b18 = local_738[1];
      uStack_b10 = auVar34._0_8_;
      uStack_b08 = auVar34._8_8_;
      local_740 = (undefined1 (*) [16])(*local_6e8 + (long)(local_8ac * 5) * 2);
      local_820 = *(undefined8 *)*local_740;
      uStack_818 = *(undefined8 *)(*local_740 + 8);
      auVar11._16_8_ = local_780;
      auVar11._0_16_ = *local_6e8;
      auVar11._24_8_ = uStack_778;
      auVar10._16_8_ = local_7a0;
      auVar10._0_16_ = *local_6f8;
      auVar10._24_8_ = uStack_798;
      local_9e0 = vpunpcklwd_avx2(auVar11,auVar10);
      auVar9._16_8_ = local_7c0;
      auVar9._0_16_ = *local_708;
      auVar9._24_8_ = uStack_7b8;
      auVar8._16_8_ = local_7e0;
      auVar8._0_16_ = *local_718;
      auVar8._24_8_ = uStack_7d8;
      local_9c0 = vpunpcklwd_avx2(auVar9,auVar8);
      auVar7._16_8_ = local_800;
      auVar7._0_16_ = *local_728;
      auVar7._24_8_ = uStack_7f8;
      auVar31._16_8_ = local_b20;
      auVar31._0_16_ = *local_740;
      auVar31._24_8_ = uStack_b18;
      local_9a0 = vpunpcklwd_avx2(auVar7,auVar31);
      auVar19._16_8_ = local_780;
      auVar19._0_16_ = *local_6e8;
      auVar19._24_8_ = uStack_778;
      auVar18._16_8_ = local_7a0;
      auVar18._0_16_ = *local_6f8;
      auVar18._24_8_ = uStack_798;
      local_960 = vpunpckhwd_avx2(auVar19,auVar18);
      auVar17._16_8_ = local_7c0;
      auVar17._0_16_ = *local_708;
      auVar17._24_8_ = uStack_7b8;
      auVar16._16_8_ = local_7e0;
      auVar16._0_16_ = *local_718;
      auVar16._24_8_ = uStack_7d8;
      local_940 = vpunpckhwd_avx2(auVar17,auVar16);
      auVar15._16_8_ = local_800;
      auVar15._0_16_ = *local_728;
      auVar15._24_8_ = uStack_7f8;
      auVar14._16_8_ = local_b20;
      auVar14._0_16_ = *local_740;
      auVar14._24_8_ = uStack_b18;
      auVar34 = ZEXT3264(auVar14);
      local_920 = vpunpckhwd_avx2(auVar15,auVar14);
      local_810 = local_b20;
      uStack_808 = uStack_b18;
      for (local_8c8 = 0; local_8c8 < local_8c4; local_8c8 = local_8c8 + 2) {
        lVar1 = local_8d8 + (long)(int)(local_8c8 * local_8ac + local_8cc) * 2;
        auVar30._8_8_ = uStack_b18;
        auVar30._0_8_ = local_b20;
        auVar4._16_8_ = uStack_b10;
        auVar4._0_16_ = auVar30;
        auVar4._24_8_ = uStack_b08;
        local_748 = (undefined1 (*) [16])(lVar1 + (long)(local_8ac * 7) * 2);
        uStack_b10 = *(undefined8 *)*local_748;
        uStack_b08 = *(undefined8 *)(*local_748 + 8);
        auVar30 = ZEXT116(0) * *local_748 + ZEXT116(1) * auVar30;
        auVar33 = ZEXT116(0) * auVar4._16_16_ + ZEXT116(1) * *local_748;
        local_750 = (undefined8 *)(lVar1 + (long)(local_8ac << 3) * 2);
        local_b20 = *local_750;
        uStack_b18 = local_750[1];
        local_758 = (undefined1 (*) [16])(lVar1 + (long)(local_8ac * 7) * 2);
        local_850 = *(undefined8 *)*local_758;
        uStack_848 = *(undefined8 *)(*local_758 + 8);
        uStack_bf0 = auVar33._0_8_;
        uStack_be8 = auVar33._8_8_;
        local_6c0 = auVar30._0_4_;
        uStack_6a8 = auVar33._8_4_;
        auVar6._16_8_ = uStack_bf0;
        auVar6._0_16_ = auVar30;
        auVar6._24_4_ = uStack_6a8;
        auVar6._28_4_ = auVar33._12_4_;
        auVar5._16_8_ = local_b20;
        auVar5._0_16_ = *local_758;
        auVar5._24_8_ = uStack_b18;
        local_980 = vpunpcklwd_avx2(auVar6,auVar5);
        auVar13._16_8_ = uStack_bf0;
        auVar13._0_16_ = auVar30;
        auVar13._24_8_ = uStack_be8;
        auVar12._16_8_ = local_b20;
        auVar12._0_16_ = *local_758;
        auVar12._24_8_ = uStack_b18;
        auVar31 = vpunpckhwd_avx2(auVar13,auVar12);
        puVar28 = local_a60;
        local_900 = auVar31;
        local_840 = local_b20;
        uStack_838 = uStack_b18;
        local_830 = uStack_b10;
        uStack_828 = uStack_b08;
        local_6e0 = local_850;
        uStack_6d8 = uStack_848;
        uStack_6d0 = local_b20;
        uStack_6c8 = uStack_b18;
        convolve(s_00,coeffs);
        uStack_a88 = auVar32._8_8_;
        uStack_a90 = auVar32._0_8_;
        auVar22._16_8_ = uStack_a90;
        auVar22._0_16_ = auVar29;
        auVar22._24_8_ = uStack_a88;
        auVar31 = vpaddd_avx2(auVar31,auVar22);
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar26;
        _local_c60 = vpsrad_avx2(auVar31,auVar33);
        if ((int)(local_8c0 - local_8cc) < 5) {
          if (local_8c0 == 4) {
            auVar31 = vpackssdw_avx2(_local_c60,_local_c60);
            auVar24._16_8_ = uStack_70;
            auVar24._0_16_ = auVar3;
            auVar24._24_8_ = uStack_68;
            auVar31 = vpminsw_avx2(auVar31,auVar24);
            auVar34 = ZEXT864((ulong)uVar27) << 0x40;
            _local_c60 = vpmaxsw_avx2(auVar31,ZEXT832((ulong)uVar27) << 0x40);
            *(undefined8 *)(local_8b8 + (long)(int)(local_8c8 * local_8bc + local_8cc) * 2) =
                 local_c60;
            *puStack_c48 = local_100;
          }
          else {
            auVar31 = vpackssdw_avx2(_local_c60,_local_c60);
            auVar23._16_8_ = uStack_70;
            auVar23._0_16_ = auVar3;
            auVar23._24_8_ = uStack_68;
            auVar31 = vpminsw_avx2(auVar31,auVar23);
            _local_c60 = vpmaxsw_avx2(auVar31,ZEXT832((ulong)uVar27) << 0x40);
            auVar34 = ZEXT864((ulong)uVar27) << 0x40;
            v[1]._0_4_ = local_8cc;
            v[0] = (longlong)puVar28;
            v[1]._4_4_ = 0;
            xx_storel_32((void *)(local_8b8 + (long)(int)(local_8c8 * local_8bc + local_8cc) * 2),v)
            ;
            v_00[0] = (ulong)local_8cc;
            v_00[1]._0_4_ = local_8bc;
            v_00[1]._4_4_ = 0;
            xx_storel_32((void *)(local_8b8 +
                                 (long)(int)(local_8c8 * local_8bc + local_8cc + local_8bc) * 2),
                         v_00);
          }
        }
        else {
          auVar31 = _local_c60;
          convolve(s_00,coeffs);
          auVar21._16_8_ = uStack_a90;
          auVar21._0_16_ = auVar29;
          auVar21._24_8_ = uStack_a88;
          auVar31 = vpaddd_avx2(auVar31,auVar21);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = uVar26;
          auVar31 = vpsrad_avx2(auVar31,auVar20);
          auVar31 = vpackssdw_avx2(_local_c60,auVar31);
          auVar25._16_8_ = uStack_70;
          auVar25._0_16_ = auVar3;
          auVar25._24_8_ = uStack_68;
          auVar31 = vpminsw_avx2(auVar31,auVar25);
          auVar34 = ZEXT864((ulong)uVar27) << 0x40;
          auVar31 = vpmaxsw_avx2(auVar31,ZEXT832((ulong)uVar27) << 0x40);
          puVar2 = (undefined8 *)(local_8b8 + (long)(int)(local_8c8 * local_8bc + local_8cc) * 2);
          filter_params = auVar31._8_8_;
          uStack_cb0 = auVar31._16_8_;
          uStack_ca8 = auVar31._24_8_;
          *puVar2 = auVar31._0_8_;
          puVar2[1] = filter_params;
          puVar2 = (undefined8 *)
                   (local_8b8 + (long)(int)(local_8c8 * local_8bc + local_8cc + local_8bc) * 2);
          *puVar2 = uStack_cb0;
          puVar2[1] = uStack_ca8;
        }
        local_9e0 = local_9c0;
        local_9c0 = local_9a0;
        local_9a0 = local_980;
        local_960 = local_940;
        local_940 = local_920;
        local_920 = local_900;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_y_sr_avx2(const uint16_t *src, int src_stride,
                                   uint16_t *dst, int dst_stride, int w, int h,
                                   const InterpFilterParams *filter_params_y,
                                   const int subpel_y_qn, int bd) {
  if (filter_params_y->taps == 12) {
    av1_highbd_convolve_y_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                   filter_params_y, subpel_y_qn, bd);
    return;
  }
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;

  __m256i s[8], coeffs_y[4];

  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_bits), round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}